

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

_Bool ggml_graph_compute_thread_ready(ggml_compute_state *state)

{
  int iVar1;
  int iVar2;
  ggml_threadpool *pgVar3;
  byte bVar4;
  
  bVar4 = 1;
  if (((state->pending == false) && (pgVar3 = state->threadpool, (pgVar3->stop & 1U) == 0)) &&
     ((pgVar3->pause & 1U) == 0)) {
    iVar1 = pgVar3->n_graph;
    if (iVar1 == state->last_graph) {
      bVar4 = state->pending;
    }
    else {
      iVar2 = state->threadpool->n_threads_cur;
      bVar4 = state->ith < iVar2;
      state->pending = state->ith < iVar2;
      state->last_graph = iVar1;
    }
  }
  return (_Bool)(bVar4 & 1);
}

Assistant:

static inline bool ggml_graph_compute_thread_ready(struct ggml_compute_state * state) {
    struct ggml_threadpool * threadpool = state->threadpool;

    if (state->pending || threadpool->stop || threadpool->pause) { return true; }

    // check for new graph/work
    int new_graph = atomic_load_explicit(&threadpool->n_graph, memory_order_relaxed);
    if (new_graph != state->last_graph) {
        state->pending    = ggml_graph_compute_thread_active(state);
        state->last_graph = new_graph;
    }

    return state->pending;
}